

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamFtp_p.cpp
# Opt level: O2

void __thiscall BamTools::Internal::BamFtp::~BamFtp(BamFtp *this)

{
  TcpSocket *pTVar1;
  
  (this->super_IBamIODevice)._vptr_IBamIODevice = (_func_int **)&PTR__BamFtp_00171960;
  Close(this);
  pTVar1 = this->m_commandSocket;
  if (pTVar1 != (TcpSocket *)0x0) {
    TcpSocket::~TcpSocket(pTVar1);
    operator_delete(pTVar1);
  }
  pTVar1 = this->m_dataSocket;
  if (pTVar1 != (TcpSocket *)0x0) {
    TcpSocket::~TcpSocket(pTVar1);
    operator_delete(pTVar1);
  }
  std::__cxx11::string::~string((string *)&this->m_response);
  std::__cxx11::string::~string((string *)&this->m_password);
  std::__cxx11::string::~string((string *)&this->m_username);
  std::__cxx11::string::~string((string *)&this->m_filename);
  std::__cxx11::string::~string((string *)&this->m_dataHostname);
  std::__cxx11::string::~string((string *)&this->m_hostname);
  IBamIODevice::~IBamIODevice(&this->super_IBamIODevice);
  return;
}

Assistant:

BamFtp::~BamFtp(void) {

    // close connection & clean up
    Close();
    if ( m_commandSocket )
        delete m_commandSocket;
    if ( m_dataSocket )
        delete m_dataSocket;
}